

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGUIElement.h
# Opt level: O3

IGUIElement * __thiscall
irr::gui::IGUIElement::getElementFromPoint(IGUIElement *this,vector2d<int> *point)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  int iVar3;
  IGUIElement *pIVar4;
  _List_node_base *p_Var5;
  
  iVar3 = (*(this->super_IEventReceiver)._vptr_IEventReceiver[0xd])();
  if ((char)iVar3 != '\0') {
    p_Var1 = (this->Children).
             super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    for (p_Var5 = (_List_node_base *)&this->Children; p_Var5 != p_Var1; p_Var5 = p_Var5->_M_prev) {
      p_Var2 = p_Var5->_M_prev[1]._M_next;
      pIVar4 = (IGUIElement *)(*(code *)p_Var2->_M_next[2]._M_next)(p_Var2,point);
      if (pIVar4 != (IGUIElement *)0x0) {
        return pIVar4;
      }
    }
  }
  iVar3 = (*(this->super_IEventReceiver)._vptr_IEventReceiver[0xd])(this);
  if ((char)iVar3 == '\0') {
    pIVar4 = (IGUIElement *)0x0;
  }
  else {
    iVar3 = (*(this->super_IEventReceiver)._vptr_IEventReceiver[5])(this,point);
    pIVar4 = (IGUIElement *)0x0;
    if ((char)iVar3 != '\0') {
      pIVar4 = this;
    }
  }
  return pIVar4;
}

Assistant:

virtual IGUIElement *getElementFromPoint(const core::position2d<s32> &point)
	{
		IGUIElement *target = 0;

		if (isVisible()) {
			// we have to search from back to front, because later children
			// might be drawn over the top of earlier ones.
			auto it = Children.rbegin();
			auto ie = Children.rend();
			while (it != ie) {
				target = (*it)->getElementFromPoint(point);
				if (target)
					return target;

				++it;
			}
		}

		if (isVisible() && isPointInside(point))
			target = this;

		return target;
	}